

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  char *__s;
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  byte *__s_00;
  byte *pbVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  byte bVar12;
  int iVar13;
  ptrdiff_t _Num;
  ulong uVar14;
  
  iVar13 = this->num_digits_;
  uVar8 = this->exp_ + iVar13;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar13 = this->num_digits_;
    iVar1 = (this->specs_).precision;
    uVar10 = iVar1 - iVar13;
    bVar12 = (byte)(*(uint *)&(this->specs_).field_0x4 >> 0x15) & 1 &
             (uVar10 != 0 && iVar13 <= iVar1);
    if ((iVar13 < 2) && (bVar12 == 0)) {
      pcVar5 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar5 = it + 2;
    }
    sVar11 = (long)this->num_digits_ - 1;
    if ((long)this->num_digits_ != 1) {
      memmove(pcVar5,this->digits_ + 1,sVar11);
    }
    __s_00 = (byte *)(pcVar5 + sVar11);
    pbVar6 = __s_00;
    if (bVar12 != 0) {
      pbVar6 = __s_00 + uVar10;
      memset(__s_00,0x30,(ulong)uVar10);
    }
    *pbVar6 = ((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar5 = write_exponent<char,char*>(uVar8 - 1,(char *)(pbVar6 + 1));
    return pcVar5;
  }
  if (this->exp_ < 0) {
    if ((int)uVar8 < 1) {
      *it = '0';
      uVar9 = -uVar8;
      uVar10 = (this->specs_).precision;
      uVar3 = uVar9;
      if (SBORROW4(uVar10,uVar9) != (int)(uVar10 + uVar8) < 0) {
        uVar3 = uVar10;
      }
      if ((int)uVar10 < 0) {
        uVar3 = uVar9;
      }
      uVar8 = this->num_digits_;
      uVar14 = (ulong)uVar8;
      if (0 < (int)uVar8 && ((this->specs_).field_0x6 & 0x20) == 0) {
        uVar14 = (ulong)uVar8;
        do {
          if (this->digits_[uVar14 - 1] != '0') goto LAB_0011e7b6;
          bVar2 = 1 < (long)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar2);
        uVar14 = 0;
      }
LAB_0011e7b6:
      iVar13 = (int)uVar14;
      if (uVar3 == 0 && iVar13 == 0) {
        pcVar5 = it + 1;
      }
      else {
        it[1] = this->decimal_point_;
        pcVar7 = it + 2;
        pcVar5 = pcVar7;
        if (0 < (int)uVar3) {
          pcVar5 = pcVar7 + uVar3;
          memset(pcVar7,0x30,(ulong)uVar3);
        }
        if (iVar13 != 0) {
          memmove(pcVar5,this->digits_,(long)iVar13);
        }
        pcVar5 = pcVar5 + iVar13;
      }
    }
    else {
      uVar14 = (ulong)uVar8;
      memmove(it,this->digits_,uVar14);
      pcVar5 = it + uVar14;
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        uVar10 = this->num_digits_;
        uVar4 = (ulong)uVar10;
        if ((int)uVar8 < (int)uVar10) {
          uVar4 = (ulong)(int)uVar10;
          do {
            if (this->digits_[uVar4 - 1] != '0') goto LAB_0011e73a;
            uVar4 = uVar4 - 1;
          } while ((long)uVar14 < (long)uVar4);
          uVar4 = (ulong)uVar8;
        }
LAB_0011e73a:
        uVar10 = (uint)uVar4;
        if (uVar10 != uVar8) {
          *pcVar5 = this->decimal_point_;
          pcVar5 = pcVar5 + 1;
        }
        if (uVar10 != uVar8) {
          memmove(pcVar5,this->digits_ + uVar14,(long)(int)uVar10 - uVar14);
        }
        pcVar5 = pcVar5 + ((long)(int)uVar10 - uVar14);
      }
      else {
        *pcVar5 = this->decimal_point_;
        sVar11 = (long)this->num_digits_ - uVar14;
        if (this->num_digits_ != uVar8) {
          memmove(pcVar5 + 1,this->digits_ + uVar14,sVar11);
        }
        pcVar5 = pcVar5 + 1 + sVar11;
        iVar13 = (this->specs_).precision;
        iVar1 = this->num_digits_;
        uVar8 = iVar13 - iVar1;
        if ((uVar8 != 0 && iVar1 <= iVar13) && (uVar8 != 0 && iVar1 <= iVar13)) {
          memset(pcVar5,0x30,(ulong)uVar8);
          pcVar5 = pcVar5 + uVar8;
        }
      }
    }
  }
  else {
    if (iVar13 != 0) {
      memmove(it,this->digits_,(long)iVar13);
    }
    pcVar5 = it + iVar13;
    uVar10 = uVar8 - this->num_digits_;
    pcVar7 = pcVar5;
    if (uVar10 != 0 && this->num_digits_ <= (int)uVar8) {
      pcVar7 = pcVar5 + uVar10;
      memset(pcVar5,0x30,(ulong)uVar10);
    }
    pcVar5 = pcVar7;
    if (((this->specs_).field_0x6 & 0x20) != 0) {
      __s = pcVar7 + 1;
      *pcVar7 = this->decimal_point_;
      iVar13 = (this->specs_).precision;
      uVar10 = iVar13 - uVar8;
      if (uVar10 == 0 || iVar13 < (int)uVar8) {
        pcVar5 = __s;
        if ((this->specs_).field_0x4 != '\x02') {
          pcVar7[1] = '0';
          pcVar5 = pcVar7 + 2;
        }
      }
      else {
        pcVar5 = __s + uVar10;
        memset(__s,0x30,(ulong)uVar10);
      }
    }
  }
  return pcVar5;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }